

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

HT_ErrorCode ht_feature_callstack_enable(HT_Timeline *timeline)

{
  HT_Feature *feature_00;
  HT_Feature *feature;
  HT_Timeline *pHStack_18;
  HT_ErrorCode error_code;
  HT_Timeline *timeline_local;
  
  pHStack_18 = timeline;
  feature_00 = ht_feature_callstack_create((HT_ErrorCode *)((long)&feature + 4));
  if (feature_00 == (HT_Feature *)0x0) {
    timeline_local._4_4_ = feature._4_4_;
  }
  else {
    timeline_local._4_4_ = ht_timeline_set_feature(pHStack_18,feature_00);
  }
  return timeline_local._4_4_;
}

Assistant:

HT_ErrorCode
ht_feature_callstack_enable(HT_Timeline* timeline)
{
    HT_ErrorCode error_code;
    HT_Feature* feature = ht_feature_callstack_create(&error_code);

    if (!feature)
    {
        return error_code;
    }

    return ht_timeline_set_feature(timeline, feature);
}